

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  Mat *bottom_blob;
  Allocator *_allocator;
  int *piVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  int _h_00;
  int iVar9;
  pointer pMVar10;
  void *__src;
  Mat *pMVar11;
  void *__dest;
  ulong uVar12;
  Mat m;
  Mat m_11;
  Mat m_3;
  Mat m_10;
  Mat local_298;
  Mat local_248;
  Mat m_8;
  Mat m_2;
  Mat m_1;
  Mat m_9;
  Mat m_19;
  Mat m_18;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar9 = this->direction;
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize._0_4_ = 0;
  local_248.elemsize._4_4_ = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  local_298.cstep = 0;
  local_298.data = (void *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize._0_4_ = 0;
  local_298.elemsize._4_4_ = 0;
  local_298.elempack = 0;
  local_298.allocator = (Allocator *)0x0;
  local_298.dims = 0;
  local_298.w = 0;
  local_298.h = 0;
  local_298.d = 0;
  local_298.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  iVar5 = -100;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    pMVar11 = bottom_blob;
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,bottom_blob);
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_248.allocator == (Allocator *)0x0) {
          free(local_248.data);
        }
        else {
          (*(local_248.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_248.data = m.data;
    local_248.refcount._0_4_ = m.refcount._0_4_;
    local_248.refcount._4_4_ = m.refcount._4_4_;
    local_248.elemsize._0_4_ = (undefined4)m.elemsize;
    local_248.elemsize._4_4_ = m.elemsize._4_4_;
    local_248.elempack = m.elempack;
    local_248.allocator = m.allocator;
    local_248.dims = m.dims;
    local_248.w = m.w;
    local_248.h = m.h;
    uVar3._0_4_ = m.d;
    uVar3._4_4_ = m.c;
    local_248.d = m.d;
    local_248.c = m.c;
    local_248.cstep = m.cstep;
    sVar8 = m.cstep;
    uVar4 = uVar3;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      uVar4 = local_248._52_8_;
      if (*piVar1 == 0) {
        local_248._52_8_ = uVar3;
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
          uVar4 = local_248._52_8_;
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
          uVar4 = local_248._52_8_;
        }
      }
    }
    local_248._52_8_ = uVar4;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar8,
               pMVar11);
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_298.allocator == (Allocator *)0x0) {
          free(local_298.data);
        }
        else {
          (*(local_298.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_298.data = m.data;
    local_298.refcount._0_4_ = m.refcount._0_4_;
    local_298.refcount._4_4_ = m.refcount._4_4_;
    local_298.elemsize._0_4_ = (undefined4)m.elemsize;
    local_298.elemsize._4_4_ = m.elemsize._4_4_;
    local_298.elempack = m.elempack;
    local_298.allocator = m.allocator;
    local_298.dims = m.dims;
    local_298.w = m.w;
    local_298.h = m.h;
    local_298.d = m.d;
    local_298.c = m.c;
    local_298.cstep = m.cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    _h_00 = (iVar9 == 2) + 1;
    Mat::create(&local_248,this->num_output,_h_00,4,_allocator);
    if (local_248.data == (void *)0x0) goto LAB_0032f085;
    if (local_248.cstep * (long)local_248.c == 0) goto LAB_0032f085;
    uVar7 = (int)local_248.cstep * local_248.c;
    uVar12 = 0;
    uVar6 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar6 = uVar12;
    }
    for (; (int)uVar6 != (int)uVar12; uVar12 = uVar12 + 1) {
      *(undefined4 *)((long)local_248.data + uVar12 * 4) = 0;
    }
    Mat::create(&local_298,this->hidden_size,_h_00,4,_allocator);
    if (local_298.data == (void *)0x0) goto LAB_0032f085;
    if (local_298.cstep * (long)local_298.c == 0) goto LAB_0032f085;
    uVar7 = (int)local_298.cstep * local_298.c;
    uVar12 = 0;
    uVar6 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar6 = uVar12;
    }
    for (; (int)uVar6 != (int)uVar12; uVar12 = uVar12 + 1) {
      *(undefined4 *)((long)local_298.data + uVar12 * 4) = 0;
    }
  }
  pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(pMVar11,this->num_output << (iVar9 == 2),_h,4,opt->blob_allocator);
  if ((pMVar11->data == (void *)0x0) || ((long)pMVar11->c * pMVar11->cstep == 0)) goto LAB_0032f085;
  uVar7 = this->direction;
  if (uVar7 < 2) {
    if (this->int8_scale_term == 0) {
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.data = (this->weight_xc_data).data;
      uVar6 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar6;
      m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m.c = (this->weight_xc_data).d;
      m.d = 1;
      iVar9 = (this->weight_xc_data).dims;
      m.dims = iVar9 + -1;
      m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar9 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.data = (this->bias_c_data).data;
      uVar6 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar6;
      m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m_1.c = (this->bias_c_data).d;
      m_1.d = 1;
      iVar9 = (this->bias_c_data).dims;
      m_1.dims = iVar9 + -1;
      m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar9 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = (this->weight_hc_data).d;
      m_2.data = (this->weight_hc_data).data;
      m_2.elemsize = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar8 = (long)m_2.h * (long)m_2.w;
      iVar9 = (this->weight_hc_data).dims;
      m_2.dims = iVar9 + -1;
      m_2.cstep = (m_2.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar9 == 4) {
        m_2.cstep = sVar8;
      }
      if (this->num_output == this->hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->weight_hr_data).w;
        m_3.h = (this->weight_hr_data).h;
        m_3.c = (this->weight_hr_data).d;
        m_3.data = (this->weight_hr_data).data;
        uVar6 = (this->weight_hr_data).elemsize;
        m_3.elempack = (this->weight_hr_data).elempack;
        m_3.allocator = (this->weight_hr_data).allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar6;
        m_3.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_3.d = 1;
        iVar9 = (this->weight_hr_data).dims;
        m_3.dims = iVar9 + -1;
        m_3.cstep = (uVar6 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar9 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar5 = lstm(bottom_blob,pMVar11,uVar7,&m,&m_1,&m_2,&m_3,&local_248,&local_298,opt);
    }
    else {
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.data = (this->weight_xc_data).data;
      uVar6 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar6;
      m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m.c = (this->weight_xc_data).d;
      m.d = 1;
      iVar9 = (this->weight_xc_data).dims;
      m.dims = iVar9 + -1;
      m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar9 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.data = (this->bias_c_data).data;
      uVar6 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar6;
      m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m_1.c = (this->bias_c_data).d;
      m_1.d = 1;
      iVar9 = (this->bias_c_data).dims;
      m_1.dims = iVar9 + -1;
      m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar9 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = (this->weight_hc_data).d;
      m_2.data = (this->weight_hc_data).data;
      m_2.elemsize = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar8 = (long)m_2.h * (long)m_2.w;
      iVar9 = (this->weight_hc_data).dims;
      m_2.dims = iVar9 + -1;
      m_2.cstep = (m_2.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar9 == 4) {
        m_2.cstep = sVar8;
      }
      if (this->num_output == this->hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->weight_hr_data).w;
        m_3.h = (this->weight_hr_data).h;
        m_3.c = (this->weight_hr_data).d;
        m_3.data = (this->weight_hr_data).data;
        uVar6 = (this->weight_hr_data).elemsize;
        m_3.elempack = (this->weight_hr_data).elempack;
        m_3.allocator = (this->weight_hr_data).allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar6;
        m_3.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_3.d = 1;
        iVar9 = (this->weight_hr_data).dims;
        m_3.dims = iVar9 + -1;
        m_3.cstep = (uVar6 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar9 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar5 = lstm_int8(bottom_blob,pMVar11,uVar7,&m,
                        (float *)(this->weight_xc_data_int8_scales).data,&m_1,&m_2,
                        (float *)(this->weight_hc_data_int8_scales).data,&m_3,&local_248,&local_298,
                        opt);
    }
    if (iVar5 != 0) goto LAB_0032f085;
    uVar7 = this->direction;
  }
  if (uVar7 == 2) {
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.allocator = (Allocator *)0x0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
    iVar5 = -100;
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      bVar2 = false;
    }
    else {
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.allocator = (Allocator *)0x0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
      iVar5 = -100;
      if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
        bVar2 = false;
      }
      else {
        m_2.cstep = (size_t)local_248.w;
        m_2.elemsize = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
        m_2.data = local_248.data;
        m_2.refcount = (int *)0x0;
        m_2.elempack = local_248.elempack;
        m_2.allocator = local_248.allocator;
        m_3.dims = 2;
        m_2.w = local_248.w;
        m_2.h = 1;
        m_2.d = 1;
        iVar9 = 1;
        m_3.cstep = (size_t)local_298.w;
        m_3.data = local_298.data;
        m_3.refcount._0_4_ = 0;
        m_3.refcount._4_4_ = 0;
        m_3.elemsize._0_4_ = (undefined4)local_298.elemsize;
        m_3.elemsize._4_4_ = local_298.elemsize._4_4_;
        m_3.elempack = local_298.elempack;
        m_3.allocator = local_298.allocator;
        m_3.w = local_298.w;
        m_3.h = 1;
        m_3.d = 1;
        m_3.c = iVar9;
        m_2.dims = m_3.dims;
        m_2.c = iVar9;
        if (this->int8_scale_term == 0) {
          m_8.w = (this->weight_xc_data).w;
          m_8.h = (this->weight_xc_data).h;
          m_8.c = (this->weight_xc_data).d;
          m_8.data = (this->weight_xc_data).data;
          m_8.elemsize = (this->weight_xc_data).elemsize;
          m_8.elempack = (this->weight_xc_data).elempack;
          m_8.allocator = (this->weight_xc_data).allocator;
          m_8.refcount = (int *)0x0;
          m_8.d = 1;
          sVar8 = (long)m_8.h * (long)m_8.w;
          iVar5 = (this->weight_xc_data).dims;
          m_8.dims = iVar5 + -1;
          m_8.cstep = (m_8.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_8.elemsize;
          if (iVar5 == 4) {
            m_8.cstep = sVar8;
          }
          m_9.w = (this->bias_c_data).w;
          m_9.h = (this->bias_c_data).h;
          m_9.c = (this->bias_c_data).d;
          m_9.data = (this->bias_c_data).data;
          m_9.elemsize = (this->bias_c_data).elemsize;
          m_9.elempack = (this->bias_c_data).elempack;
          m_9.allocator = (this->bias_c_data).allocator;
          m_9.refcount = (int *)0x0;
          m_9.d = 1;
          sVar8 = (long)m_9.h * (long)m_9.w;
          iVar5 = (this->bias_c_data).dims;
          m_9.dims = iVar5 + -1;
          m_9.cstep = (m_9.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_9.elemsize;
          if (iVar5 == 4) {
            m_9.cstep = sVar8;
          }
          m_10.w = (this->weight_hc_data).w;
          m_10.h = (this->weight_hc_data).h;
          m_10.c = (this->weight_hc_data).d;
          m_10.data = (this->weight_hc_data).data;
          m_10.elemsize = (this->weight_hc_data).elemsize;
          m_10.elempack = (this->weight_hc_data).elempack;
          m_10.allocator = (this->weight_hc_data).allocator;
          m_10.refcount = (int *)0x0;
          m_10.d = 1;
          iVar5 = (this->weight_hc_data).dims;
          m_10.dims = iVar5 + -1;
          m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0) /
                       m_10.elemsize;
          if (iVar5 == 4) {
            m_10.cstep = (long)m_10.h * (long)m_10.w;
          }
          if (this->num_output == this->hidden_size) {
            m_11.cstep = 0;
            m_11.data = (void *)0x0;
            m_11.elemsize._0_4_ = 0;
            m_11.elemsize._4_4_ = 0;
            m_11.elempack = 0;
            m_11.allocator = (Allocator *)0x0;
            m_11.dims = 0;
            m_11.w = 0;
            m_11.h = 0;
            m_11.d = 0;
            m_11.c = 0;
          }
          else {
            m_11.w = (this->weight_hr_data).w;
            m_11.h = (this->weight_hr_data).h;
            m_11.data = (this->weight_hr_data).data;
            uVar6 = (this->weight_hr_data).elemsize;
            m_11.elempack = (this->weight_hr_data).elempack;
            m_11.allocator = (this->weight_hr_data).allocator;
            m_11.elemsize._0_4_ = (undefined4)uVar6;
            m_11.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_11.c = (this->weight_hr_data).d;
            m_11.d = 1;
            iVar5 = (this->weight_hr_data).dims;
            m_11.dims = iVar5 + -1;
            m_11.cstep = (uVar6 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar5 == 4) {
              m_11.cstep = (long)m_11.h * (long)m_11.w;
            }
          }
          m_11.refcount._4_4_ = 0;
          m_11.refcount._0_4_ = 0;
          iVar5 = lstm(bottom_blob,&m,0,&m_8,&m_9,&m_10,&m_11,&m_2,&m_3,opt);
          if (iVar5 == 0) goto LAB_0032f362;
LAB_0032f217:
          bVar2 = false;
        }
        else {
          m_8.w = (this->weight_xc_data).w;
          m_8.h = (this->weight_xc_data).h;
          m_8.c = (this->weight_xc_data).d;
          m_8.data = (this->weight_xc_data).data;
          m_8.elemsize = (this->weight_xc_data).elemsize;
          m_8.elempack = (this->weight_xc_data).elempack;
          m_8.allocator = (this->weight_xc_data).allocator;
          m_8.refcount = (int *)0x0;
          m_8.d = 1;
          sVar8 = (long)m_8.h * (long)m_8.w;
          iVar5 = (this->weight_xc_data).dims;
          m_8.dims = iVar5 + -1;
          m_8.cstep = (m_8.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_8.elemsize;
          if (iVar5 == 4) {
            m_8.cstep = sVar8;
          }
          m_9.w = (this->bias_c_data).w;
          m_9.h = (this->bias_c_data).h;
          m_9.c = (this->bias_c_data).d;
          m_9.data = (this->bias_c_data).data;
          m_9.elemsize = (this->bias_c_data).elemsize;
          m_9.elempack = (this->bias_c_data).elempack;
          m_9.allocator = (this->bias_c_data).allocator;
          m_9.refcount = (int *)0x0;
          m_9.d = 1;
          sVar8 = (long)m_9.h * (long)m_9.w;
          iVar5 = (this->bias_c_data).dims;
          m_9.dims = iVar5 + -1;
          m_9.cstep = (m_9.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_9.elemsize;
          if (iVar5 == 4) {
            m_9.cstep = sVar8;
          }
          m_10.w = (this->weight_hc_data).w;
          m_10.h = (this->weight_hc_data).h;
          m_10.c = (this->weight_hc_data).d;
          m_10.data = (this->weight_hc_data).data;
          m_10.elemsize = (this->weight_hc_data).elemsize;
          m_10.elempack = (this->weight_hc_data).elempack;
          m_10.allocator = (this->weight_hc_data).allocator;
          m_10.refcount = (int *)0x0;
          m_10.d = 1;
          iVar5 = (this->weight_hc_data).dims;
          m_10.dims = iVar5 + -1;
          m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0) /
                       m_10.elemsize;
          if (iVar5 == 4) {
            m_10.cstep = (long)m_10.h * (long)m_10.w;
          }
          if (this->num_output == this->hidden_size) {
            m_11.cstep = 0;
            m_11.data = (void *)0x0;
            m_11.elemsize._0_4_ = 0;
            m_11.elemsize._4_4_ = 0;
            m_11.elempack = 0;
            m_11.allocator = (Allocator *)0x0;
            m_11.dims = 0;
            m_11.w = 0;
            m_11.h = 0;
            m_11.d = 0;
            m_11.c = 0;
          }
          else {
            m_11.w = (this->weight_hr_data).w;
            m_11.h = (this->weight_hr_data).h;
            m_11.data = (this->weight_hr_data).data;
            uVar6 = (this->weight_hr_data).elemsize;
            m_11.elempack = (this->weight_hr_data).elempack;
            m_11.allocator = (this->weight_hr_data).allocator;
            m_11.elemsize._0_4_ = (undefined4)uVar6;
            m_11.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_11.c = (this->weight_hr_data).d;
            m_11.d = 1;
            iVar5 = (this->weight_hr_data).dims;
            m_11.dims = iVar5 + -1;
            m_11.cstep = (uVar6 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar5 == 4) {
              m_11.cstep = (long)m_11.h * (long)m_11.w;
            }
          }
          m_11.refcount._4_4_ = 0;
          m_11.refcount._0_4_ = 0;
          iVar5 = lstm_int8(bottom_blob,&m,0,&m_8,(float *)(this->weight_xc_data_int8_scales).data,
                            &m_9,&m_10,(float *)(this->weight_hc_data_int8_scales).data,&m_11,&m_2,
                            &m_3,opt);
          if (iVar5 != 0) goto LAB_0032f217;
LAB_0032f362:
          m_8.cstep = (size_t)local_248.w;
          m_8.elemsize = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
          m_8.data = (void *)(m_8.elemsize * m_8.cstep + (long)local_248.data);
          m_8.refcount = (int *)0x0;
          m_8.elempack = local_248.elempack;
          m_8.allocator = local_248.allocator;
          m_8.dims = 2;
          m_8.w = local_248.w;
          m_8.h = 1;
          m_8.d = 1;
          m_9.cstep = (size_t)local_298.w;
          m_9.elemsize = CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
          m_9.data = (void *)(m_9.elemsize * m_9.cstep + (long)local_298.data);
          m_9.refcount = (int *)0x0;
          m_9.elempack = local_298.elempack;
          m_9.allocator = local_298.allocator;
          m_9.w = local_298.w;
          m_9.h = 1;
          m_9.d = 1;
          m_8.c = iVar9;
          m_9.dims = m_8.dims;
          m_9.c = iVar9;
          if (this->int8_scale_term == 0) {
            m_10.w = (this->weight_xc_data).w;
            m_10.h = (this->weight_xc_data).h;
            m_10.elemsize = (this->weight_xc_data).elemsize;
            m_10.data = (void *)((this->weight_xc_data).cstep * m_10.elemsize +
                                (long)(this->weight_xc_data).data);
            m_10.c = (this->weight_xc_data).d;
            m_10.elempack = (this->weight_xc_data).elempack;
            m_10.allocator = (this->weight_xc_data).allocator;
            m_10.refcount = (int *)0x0;
            m_10.d = 1;
            iVar9 = (this->weight_xc_data).dims;
            m_10.dims = iVar9 + -1;
            m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0) /
                         m_10.elemsize;
            if (iVar9 == 4) {
              m_10.cstep = (long)m_10.h * (long)m_10.w;
            }
            m_11.w = (this->bias_c_data).w;
            m_11.h = (this->bias_c_data).h;
            uVar6 = (this->bias_c_data).elemsize;
            m_11.data = (void *)((this->bias_c_data).cstep * uVar6 + (long)(this->bias_c_data).data)
            ;
            m_11.elempack = (this->bias_c_data).elempack;
            m_11.allocator = (this->bias_c_data).allocator;
            m_11.refcount._0_4_ = 0;
            m_11.refcount._4_4_ = 0;
            m_11.elemsize._0_4_ = (undefined4)uVar6;
            m_11.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_11.c = (this->bias_c_data).d;
            m_11.d = 1;
            iVar9 = (this->bias_c_data).dims;
            m_11.dims = iVar9 + -1;
            m_11.cstep = (uVar6 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar9 == 4) {
              m_11.cstep = (long)m_11.h * (long)m_11.w;
            }
            m_18.w = (this->weight_hc_data).w;
            m_18.h = (this->weight_hc_data).h;
            m_18.elemsize = (this->weight_hc_data).elemsize;
            m_18.data = (void *)((this->weight_hc_data).cstep * m_18.elemsize +
                                (long)(this->weight_hc_data).data);
            m_18.c = (this->weight_hc_data).d;
            m_18.elempack = (this->weight_hc_data).elempack;
            m_18.allocator = (this->weight_hc_data).allocator;
            m_18.refcount = (int *)0x0;
            m_18.d = 1;
            iVar9 = (this->weight_hc_data).dims;
            m_18.dims = iVar9 + -1;
            m_18.cstep = (m_18.elemsize * (long)m_18.h * (long)m_18.w + 0xf & 0xfffffffffffffff0) /
                         m_18.elemsize;
            if (iVar9 == 4) {
              m_18.cstep = (long)m_18.h * (long)m_18.w;
            }
            if (this->num_output == this->hidden_size) {
              m_19.cstep = 0;
              m_19.data = (void *)0x0;
              m_19.elemsize._0_4_ = 0;
              m_19.elemsize._4_4_ = 0;
              m_19.elempack = 0;
              m_19.allocator = (Allocator *)0x0;
              m_19.dims = 0;
              m_19.w = 0;
              m_19.h = 0;
              m_19.d = 0;
              m_19.c = 0;
            }
            else {
              m_19.w = (this->weight_hr_data).w;
              m_19.h = (this->weight_hr_data).h;
              uVar6 = (this->weight_hr_data).elemsize;
              m_19.data = (void *)((this->weight_hr_data).cstep * uVar6 +
                                  (long)(this->weight_hr_data).data);
              m_19.elempack = (this->weight_hr_data).elempack;
              m_19.allocator = (this->weight_hr_data).allocator;
              m_19.elemsize._0_4_ = (undefined4)uVar6;
              m_19.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
              m_19.c = (this->weight_hr_data).d;
              m_19.d = 1;
              iVar9 = (this->weight_hr_data).dims;
              m_19.dims = iVar9 + -1;
              m_19.cstep = (uVar6 * (long)m_19.h * (long)m_19.w + 0xf & 0xfffffffffffffff0) / uVar6;
              if (iVar9 == 4) {
                m_19.cstep = (long)m_19.h * (long)m_19.w;
              }
            }
            m_19.refcount._4_4_ = 0;
            m_19.refcount._0_4_ = 0;
            iVar5 = lstm(bottom_blob,&m_1,1,&m_10,&m_11,&m_18,&m_19,&m_8,&m_9,opt);
          }
          else {
            m_10.w = (this->weight_xc_data).w;
            m_10.h = (this->weight_xc_data).h;
            m_10.elemsize = (this->weight_xc_data).elemsize;
            m_10.data = (void *)((this->weight_xc_data).cstep * m_10.elemsize +
                                (long)(this->weight_xc_data).data);
            m_10.c = (this->weight_xc_data).d;
            m_10.elempack = (this->weight_xc_data).elempack;
            m_10.allocator = (this->weight_xc_data).allocator;
            m_10.refcount = (int *)0x0;
            m_10.d = 1;
            iVar9 = (this->weight_xc_data).dims;
            m_10.dims = iVar9 + -1;
            m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0) /
                         m_10.elemsize;
            if (iVar9 == 4) {
              m_10.cstep = (long)m_10.h * (long)m_10.w;
            }
            m_11.w = (this->bias_c_data).w;
            m_11.h = (this->bias_c_data).h;
            uVar6 = (this->bias_c_data).elemsize;
            m_11.data = (void *)((this->bias_c_data).cstep * uVar6 + (long)(this->bias_c_data).data)
            ;
            m_11.elempack = (this->bias_c_data).elempack;
            m_11.allocator = (this->bias_c_data).allocator;
            m_11.refcount._0_4_ = 0;
            m_11.refcount._4_4_ = 0;
            m_11.elemsize._0_4_ = (undefined4)uVar6;
            m_11.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_11.c = (this->bias_c_data).d;
            m_11.d = 1;
            iVar9 = (this->bias_c_data).dims;
            m_11.dims = iVar9 + -1;
            m_11.cstep = (uVar6 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar9 == 4) {
              m_11.cstep = (long)m_11.h * (long)m_11.w;
            }
            m_18.w = (this->weight_hc_data).w;
            m_18.h = (this->weight_hc_data).h;
            m_18.elemsize = (this->weight_hc_data).elemsize;
            m_18.data = (void *)((this->weight_hc_data).cstep * m_18.elemsize +
                                (long)(this->weight_hc_data).data);
            m_18.c = (this->weight_hc_data).d;
            m_18.elempack = (this->weight_hc_data).elempack;
            m_18.allocator = (this->weight_hc_data).allocator;
            m_18.refcount = (int *)0x0;
            m_18.d = 1;
            iVar9 = (this->weight_hc_data).dims;
            m_18.dims = iVar9 + -1;
            m_18.cstep = (m_18.elemsize * (long)m_18.h * (long)m_18.w + 0xf & 0xfffffffffffffff0) /
                         m_18.elemsize;
            if (iVar9 == 4) {
              m_18.cstep = (long)m_18.h * (long)m_18.w;
            }
            if (this->num_output == this->hidden_size) {
              m_19.cstep = 0;
              m_19.data = (void *)0x0;
              m_19.elemsize._0_4_ = 0;
              m_19.elemsize._4_4_ = 0;
              m_19.elempack = 0;
              m_19.allocator = (Allocator *)0x0;
              m_19.dims = 0;
              m_19.w = 0;
              m_19.h = 0;
              m_19.d = 0;
              m_19.c = 0;
            }
            else {
              m_19.w = (this->weight_hr_data).w;
              m_19.h = (this->weight_hr_data).h;
              uVar6 = (this->weight_hr_data).elemsize;
              m_19.data = (void *)((this->weight_hr_data).cstep * uVar6 +
                                  (long)(this->weight_hr_data).data);
              m_19.elempack = (this->weight_hr_data).elempack;
              m_19.allocator = (this->weight_hr_data).allocator;
              m_19.elemsize._0_4_ = (undefined4)uVar6;
              m_19.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
              m_19.c = (this->weight_hr_data).d;
              m_19.d = 1;
              iVar9 = (this->weight_hr_data).dims;
              m_19.dims = iVar9 + -1;
              m_19.cstep = (uVar6 * (long)m_19.h * (long)m_19.w + 0xf & 0xfffffffffffffff0) / uVar6;
              if (iVar9 == 4) {
                m_19.cstep = (long)m_19.h * (long)m_19.w;
              }
            }
            m_19.refcount._4_4_ = 0;
            m_19.refcount._0_4_ = 0;
            iVar5 = lstm_int8(bottom_blob,&m_1,1,&m_10,
                              (float *)((long)(this->weight_xc_data_int8_scales).w *
                                        (this->weight_xc_data_int8_scales).elemsize +
                                       (long)(this->weight_xc_data_int8_scales).data),&m_11,&m_18,
                              (float *)((long)(this->weight_hc_data_int8_scales).w *
                                        (this->weight_hc_data_int8_scales).elemsize +
                                       (long)(this->weight_hc_data_int8_scales).data),&m_19,&m_8,
                              &m_9,opt);
          }
          if (iVar5 == 0) {
            iVar5 = 0;
            uVar6 = (ulong)_h;
            if ((int)_h < 1) {
              uVar6 = 0;
            }
            for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
              __src = (void *)((long)m_1.w * uVar12 *
                               CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                              (long)m_1.data);
              __dest = (void *)((long)pMVar11->w * uVar12 * pMVar11->elemsize + (long)pMVar11->data)
              ;
              memcpy(__dest,(void *)((long)m.w * uVar12 *
                                     CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                    (long)m.data),(long)this->num_output << 2);
              memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                     (long)this->num_output << 2);
            }
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          if (m_8.refcount != (int *)0x0) {
            LOCK();
            *m_8.refcount = *m_8.refcount + -1;
            UNLOCK();
            if (*m_8.refcount == 0) {
              if (m_8.allocator == (Allocator *)0x0) {
                free(m_8.data);
              }
              else {
                (*(m_8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar1 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                free(m_3.data);
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        if (m_2.refcount != (int *)0x0) {
          LOCK();
          *m_2.refcount = *m_2.refcount + -1;
          UNLOCK();
          if (*m_2.refcount == 0) {
            if (m_2.allocator == (Allocator *)0x0) {
              free(m_2.data);
            }
            else {
              (*(m_2.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar1 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar2) goto LAB_0032f085;
  }
  pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar5 = 0;
  if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pMVar10 == 0xd8) {
    if (pMVar10 + 1 != &local_248) {
      piVar1 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = pMVar10[1].refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (pMVar10[1].allocator == (Allocator *)0x0) {
            free(pMVar10[1].data);
          }
          else {
            (*(pMVar10[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar10[1].data = local_248.data;
      pMVar10[1].refcount = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      pMVar10[1].elemsize = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
      pMVar10[1].elempack = local_248.elempack;
      pMVar10[1].allocator = local_248.allocator;
      pMVar10[1].dims = local_248.dims;
      pMVar10[1].w = local_248.w;
      pMVar10[1].h = local_248.h;
      pMVar10[1].d = local_248.d;
      pMVar10[1].c = local_248.c;
      pMVar10[1].cstep = local_248.cstep;
      pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    if (pMVar10 + 2 != &local_298) {
      piVar1 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = pMVar10[2].refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (pMVar10[2].allocator == (Allocator *)0x0) {
            free(pMVar10[2].data);
          }
          else {
            (*(pMVar10[2].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar10[2].data = local_298.data;
      pMVar10[2].refcount = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
      pMVar10[2].elemsize = CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
      pMVar10[2].elempack = local_298.elempack;
      pMVar10[2].allocator = local_298.allocator;
      pMVar10[2].dims = local_298.dims;
      pMVar10[2].w = local_298.w;
      pMVar10[2].h = local_298.h;
      pMVar10[2].d = local_298.d;
      pMVar10[2].c = local_298.c;
      pMVar10[2].cstep = local_298.cstep;
    }
  }
LAB_0032f085:
  piVar1 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        free(local_298.data);
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        free(local_248.data);
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob, direction, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
            if (ret != 0)
                return ret;
        }

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), weight_xc_data_int8_scales.row(1), bias_c_data.channel(1), weight_hc_data.channel(1), weight_hc_data_int8_scales.row(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}